

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecSt.c
# Opt level: O2

void Acec_StatsCollect(Gia_Man_t *p,int fVerbose)

{
  long lVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char **ppcVar8;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  word wVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  int Map [256];
  
  ppcVar8 = Kit_DsdNpn4ClassNames();
  memset(Map,0,0x400);
  p_00 = Vec_WrdStart(p->nObjs);
  p_01 = Vec_WrdStart(p->nObjs);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                  ,0x165,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  iVar4 = Gia_ManLutSizeMax(p);
  if (3 < iVar4) {
    __assert_fail("Gia_ManLutSizeMax(p) < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                  ,0x166,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  for (lVar11 = 1; lVar11 < p->nObjs; lVar11 = lVar11 + 1) {
    iVar4 = Gia_ObjIsLut(p,(int)lVar11);
    if (iVar4 != 0) {
      wVar9 = Gia_ObjComputeTruthTable6Lut(p,(int)lVar11,p_01);
      if (p_00->nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      p_00->pArray[lVar11] = wVar9;
    }
  }
  Vec_WrdFree(p_01);
  iVar4 = 1;
  do {
    if (p->nObjs <= iVar4) {
      iVar4 = 0;
      while( true ) {
        if (p->vCos->nSize <= iVar4) {
          Vec_WrdFree(p_00);
          printf("fi / fo");
          piVar12 = Map;
          for (uVar7 = 0; uVar7 != 0xe; uVar7 = uVar7 + 1) {
            printf("%6d ",(ulong)uVar7);
          }
          putchar(10);
          for (uVar10 = 0; uVar10 != 0xe; uVar10 = uVar10 + 1) {
            printf("%6d ",uVar10 & 0xffffffff);
            for (lVar11 = 0; lVar11 != 0xe; lVar11 = lVar11 + 1) {
              if (piVar12[lVar11] == 0) {
                printf("%6s ",".");
              }
              else {
                printf("%6d ");
              }
            }
            putchar(10);
            piVar12 = piVar12 + 0x10;
          }
          puts("\nClasses:");
          uVar7 = 0;
          do {
            lVar11 = -1;
            if (uVar7 == 0xe) {
              return;
            }
            do {
              if (lVar11 == 0xff) {
                __assert_fail("k < 256",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                              ,0x19a,"void Acec_StatsCollect(Gia_Man_t *, int)");
              }
              lVar1 = lVar11 + 1;
              lVar3 = lVar11 + 1;
              lVar11 = lVar1;
            } while (Npn3Table[lVar3][1] != uVar7);
            iVar4 = Dar_LibReturnClass(Npn3Table[lVar1][0] << 8 | Npn3Table[lVar1][0]);
            printf("%2d : %s\n",(ulong)uVar7,ppcVar8[iVar4]);
            uVar7 = uVar7 + 1;
          } while( true );
        }
        uVar7 = Vec_IntEntry(p->vCos,iVar4);
        if (((int)uVar7 < 0) || (p->nObjs <= (int)uVar7)) break;
        wVar9 = Vec_WrdEntry(p_00,uVar7 - (*(uint *)(p->pObjs + uVar7) & 0x1fffffff));
        if (0xe < Npn3Table[wVar9 & 0xff][1]) {
          __assert_fail("iTruthF < 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                        ,0x180,"void Acec_StatsCollect(Gia_Man_t *, int)");
        }
        Map[Npn3Table[wVar9 & 0xff][1] << 4] = Map[Npn3Table[wVar9 & 0xff][1] << 4] + 1;
        iVar4 = iVar4 + 1;
      }
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    iVar5 = Gia_ObjIsLut(p,iVar4);
    if (iVar5 != 0) {
      wVar9 = Vec_WrdEntry(p_00,iVar4);
      iVar5 = Npn3Table[wVar9 & 0xff][1];
      if (0xe < iVar5) {
        __assert_fail("iTruth < 15",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                      ,0x173,"void Acec_StatsCollect(Gia_Man_t *, int)");
      }
      lVar11 = 0;
      while( true ) {
        pVVar2 = p->vMapping;
        iVar6 = Vec_IntEntry(pVVar2,iVar4);
        iVar6 = Vec_IntEntry(pVVar2,iVar6);
        if (iVar6 <= lVar11) break;
        pVVar2 = p->vMapping;
        uVar7 = Vec_IntEntry(pVVar2,iVar4);
        if (((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        wVar9 = Vec_WrdEntry(p_00,pVVar2->pArray[(ulong)uVar7 + lVar11 + 1]);
        if (0xe < Npn3Table[wVar9 & 0xff][1]) {
          __assert_fail("iTruthF < 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                        ,0x178,"void Acec_StatsCollect(Gia_Man_t *, int)");
        }
        Map[Npn3Table[wVar9 & 0xff][1] * 0x10 + iVar5] =
             Map[Npn3Table[wVar9 & 0xff][1] * 0x10 + iVar5] + 1;
        lVar11 = lVar11 + 1;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Acec_StatsCollect( Gia_Man_t * p, int fVerbose )
{
    extern int Dar_LibReturnClass( unsigned uTruth );
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();

    int Map[256] = {0};
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    word Truth, TruthF;
    int iTruth, iTruthF;
    int iFan, iLut, i, k, Class;
    assert( Gia_ManHasMapping(p) );
    assert( Gia_ManLutSizeMax(p) < 4 );
    // collect truth tables
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Gia_ObjComputeTruthTable6Lut( p, iLut, vTemp );
        Vec_WrdWriteEntry( vTruths, iLut, Truth );
    }
    Vec_WrdFree( vTemp );
    // collect pairs
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Vec_WrdEntry( vTruths, iLut ) & 0xFF;
        iTruth = Npn3Table[Truth][1];
        assert( iTruth < 15 );
        Gia_LutForEachFanin( p, iLut, iFan, k )
        {
            TruthF = Vec_WrdEntry( vTruths, iFan ) & 0xFF;
            iTruthF = Npn3Table[TruthF][1];
            assert( iTruthF < 15 );
            Map[(iTruthF << 4) + iTruth]++;
        }
    }
    Gia_ManForEachCoDriverId( p, iFan, k )
    {
        TruthF = Vec_WrdEntry( vTruths, iFan );
        iTruthF = Npn3Table[TruthF & 0xFF][1];
        assert( iTruthF < 15 );
        Map[(iTruthF << 4)]++;
    }
    Vec_WrdFree( vTruths );
    // print statistics
    printf( "fi / fo" );
    for ( i = 0; i < 14; i++ )
        printf( "%6d ", i );
    printf( "\n" );
    for ( i = 0; i < 14; i++ )
    {
        printf( "%6d ", i );
        for ( k = 0; k < 14; k++ )
            if ( Map[(i << 4) | k] )
                printf( "%6d ", Map[(i << 4) | k] );
            else
                printf( "%6s ", "." );
        printf( "\n" );
    }
    // print class formulas
    printf( "\nClasses:\n" );
    for ( i = 0; i < 14; i++ )
    {
        for ( k = 0; k < 256; k++ )
            if ( Npn3Table[k][1] == i )
                break;
        assert( k < 256 );
        Class = Dar_LibReturnClass( (Npn3Table[k][0] << 8) | Npn3Table[k][0] );
        printf( "%2d : %s\n", i, pNames[Class] );
    }
}